

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void check_consistency(char *filename,uint32 n_mgau,uint32 n_mgau_rd,uint32 n_stream,
                      uint32 n_stream_rd,uint32 n_density,uint32 n_density_rd,uint32 *veclen,
                      uint32 *veclen_rd)

{
  uint local_28;
  uint32 s;
  uint32 n_density_local;
  uint32 n_stream_rd_local;
  uint32 n_stream_local;
  uint32 n_mgau_rd_local;
  uint32 n_mgau_local;
  char *filename_local;
  
  if (n_mgau != n_mgau_rd) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/map_adapt/main.c"
            ,0x3b,"Number of codebooks is mismatched in %s\n",filename);
    exit(1);
  }
  if (n_stream != n_stream_rd) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/map_adapt/main.c"
            ,0x3d,"Number of streams is mismatched in %s\n",filename);
    exit(1);
  }
  if (n_density != n_density_rd) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/map_adapt/main.c"
            ,0x3f,"Number of gaussians is mismatched in %s\n",filename);
    exit(1);
  }
  local_28 = 0;
  while( true ) {
    if (n_stream <= local_28) {
      return;
    }
    if (veclen[local_28] != veclen_rd[local_28]) break;
    local_28 = local_28 + 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/map_adapt/main.c"
          ,0x43,"Vector length of stream %u mismatched in %s\n",(ulong)local_28,filename);
  exit(1);
}

Assistant:

static void
check_consistency(const char *filename,
		  uint32 n_mgau, uint32 n_mgau_rd,
		  uint32 n_stream, uint32 n_stream_rd,
		  uint32 n_density, uint32 n_density_rd,
		  const uint32 *veclen, 
		  const uint32 *veclen_rd)
{
    uint32 s;

    if (n_mgau != n_mgau_rd)
	E_FATAL("Number of codebooks is mismatched in %s\n",filename);
    if (n_stream != n_stream_rd)
	E_FATAL("Number of streams is mismatched in %s\n",filename);
    if (n_density != n_density_rd)
	E_FATAL("Number of gaussians is mismatched in %s\n",filename);
    for (s = 0; s < n_stream; ++s)
	if (veclen[s] != veclen_rd[s])
	    E_FATAL("Vector length of stream %u mismatched in %s\n",
		    s, filename);
}